

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

uint8_vec * __thiscall basist::ktx2_transcoder::find_key(ktx2_transcoder *this,string *key_name)

{
  char *__s2;
  int iVar1;
  uint8_vec *puVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(this->m_key_values).m_size;
  if (uVar3 != 0) {
    __s2 = (key_name->_M_dataplus)._M_p;
    puVar2 = &((this->m_key_values).m_p)->m_value;
    do {
      iVar1 = strcmp((char *)puVar2[-1].m_p,__s2);
      if (iVar1 == 0) {
        return puVar2;
      }
      puVar2 = puVar2 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return (uint8_vec *)0x0;
}

Assistant:

const basisu::uint8_vec* ktx2_transcoder::find_key(const std::string& key_name) const
	{
		for (uint32_t i = 0; i < m_key_values.size(); i++)
			if (strcmp((const char *)m_key_values[i].m_key.data(), key_name.c_str()) == 0)
				return &m_key_values[i].m_value;

		return nullptr;
	}